

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

void __thiscall
vkt::ssbo::BufferVar::BufferVar(BufferVar *this,char *name,VarType *type,deUint32 flags)

{
  allocator<char> local_25;
  deUint32 local_24;
  VarType *pVStack_20;
  deUint32 flags_local;
  VarType *type_local;
  char *name_local;
  BufferVar *this_local;
  
  local_24 = flags;
  pVStack_20 = type;
  type_local = (VarType *)name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name,&local_25);
  std::allocator<char>::~allocator(&local_25);
  glu::VarType::VarType(&this->m_type,pVStack_20);
  this->m_flags = local_24;
  return;
}

Assistant:

BufferVar::BufferVar (const char* name, const VarType& type, deUint32 flags)
	: m_name	(name)
	, m_type	(type)
	, m_flags	(flags)
{
}